

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

ssize_t amqp_try_send(amqp_connection_state_t state,void *buf,size_t len,amqp_time_t deadline,
                     int flags)

{
  int iVar1;
  ssize_t sVar2;
  int event;
  size_t sVar3;
  
  sVar3 = len;
  do {
    while (sVar2 = (*state->socket->klass->send)(state->socket,buf,sVar3,flags), 0 < sVar2) {
      buf = (void *)((long)buf + sVar2);
      sVar3 = sVar3 - sVar2;
      if (sVar3 == 0) {
        return len;
      }
    }
    iVar1 = amqp_get_sockfd(state);
    if (iVar1 == -1) {
      sVar2 = -0x11;
    }
    else {
      if (sVar2 == -0x1301) {
        event = 2;
      }
      else {
        if (sVar2 != -0x1302) goto LAB_001096d9;
        event = 4;
      }
      iVar1 = amqp_poll(iVar1,event,deadline);
      sVar2 = (ssize_t)iVar1;
    }
LAB_001096d9:
    if (sVar2 != 0) {
      if (sVar2 == -0xd) {
        sVar2 = len - sVar3;
      }
      return sVar2;
    }
  } while( true );
}

Assistant:

ssize_t amqp_try_send(amqp_connection_state_t state, const void *buf,
                      size_t len, amqp_time_t deadline, int flags) {
  ssize_t res;
  void *buf_left = (void *)buf;
  /* Assume that len is not going to be larger than ssize_t can hold. */
  ssize_t len_left = (size_t)len;

start_send:
  res = amqp_socket_send(state->socket, buf_left, len_left, flags);

  if (res > 0) {
    len_left -= res;
    buf_left = (char *)buf_left + res;
    if (0 == len_left) {
      return (ssize_t)len;
    }
    goto start_send;
  }
  res = do_poll(state, res, deadline);
  if (AMQP_STATUS_OK == res) {
    goto start_send;
  }
  if (AMQP_STATUS_TIMEOUT == res) {
    return (ssize_t)len - len_left;
  }
  return res;
}